

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeAppendP4(Vdbe *p,void *pP4,int n)

{
  long lVar1;
  int in_EDX;
  sqlite3 *in_RSI;
  long *in_RDI;
  VdbeOp *pOp;
  void *in_stack_ffffffffffffffe0;
  
  if (*(char *)(*in_RDI + 0x61) == '\0') {
    lVar1 = in_RDI[0xd] + (long)((int)in_RDI[0x17] + -1) * 0x18;
    *(char *)(lVar1 + 1) = (char)in_EDX;
    *(sqlite3 **)(lVar1 + 0x10) = in_RSI;
  }
  else {
    freeP4(in_RSI,in_EDX,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAppendP4(Vdbe *p, void *pP4, int n){
  VdbeOp *pOp;
  assert( n!=P4_INT32 && n!=P4_VTAB );
  assert( n<=0 );
  if( p->db->mallocFailed ){
    freeP4(p->db, n, pP4);
  }else{
    assert( pP4!=0 );
    assert( p->nOp>0 );
    pOp = &p->aOp[p->nOp-1];
    assert( pOp->p4type==P4_NOTUSED );
    pOp->p4type = n;
    pOp->p4.p = pP4;
  }
}